

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Sol * earliestStart(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs
                   ,long STEPS,long THRESHOLD,long rows,long cols)

{
  vector<ride,std::allocator<ride>> *this;
  pointer prVar1;
  iterator iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  pointer prVar7;
  ride *prVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  value_type local_d8;
  ride *local_b8;
  iterator iStack_b0;
  ride *local_a8;
  Sol *local_a0;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> local_98;
  long local_70;
  long local_68;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_70 = THRESHOLD;
  local_68 = STEPS;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 6,(bool *)&local_98,
             (allocator_type *)&local_d8);
  local_a0 = __return_storage_ptr__;
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&local_98);
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < vehs) {
    lVar16 = 0;
    do {
      local_d8.avail_time = 0;
      local_d8.loc.x = 0;
      local_d8.loc.y = 0;
      local_d8.id = lVar16;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                (&local_98,&local_d8);
      lVar16 = lVar16 + 1;
    } while (vehs != lVar16);
  }
  if ((rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar15 = 0;
    do {
      local_d8.id = (local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                     super__Vector_impl_data._M_start)->id;
      local_d8.avail_time =
           (local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data
           ._M_start)->avail_time;
      local_d8.loc.x =
           ((local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).x;
      local_d8.loc.y =
           ((local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
                (&local_98);
      if (local_68 <= local_d8.avail_time) break;
      prVar7 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_start;
      prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar16 = (long)prVar1 - (long)prVar7;
      if (lVar16 != 0) {
        lVar16 = lVar16 >> 6;
        plVar13 = &(prVar7->start).y;
        lVar9 = 0x7fffffffffffffff;
        uVar14 = 0;
        do {
          if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0)
             && (local_d8.avail_time <= plVar13[-3])) {
            lVar17 = local_d8.loc.x - ((pt *)(plVar13 + -1))->x;
            lVar6 = -lVar17;
            if (0 < lVar17) {
              lVar6 = lVar17;
            }
            lVar12 = local_d8.loc.y - *plVar13;
            lVar17 = -lVar12;
            if (0 < lVar12) {
              lVar17 = lVar12;
            }
            lVar17 = lVar6 + local_d8.avail_time + lVar17;
            if (lVar17 <= plVar13[-4]) {
              lVar17 = plVar13[-4];
            }
            if ((lVar17 < lVar9) && (plVar13[-2] + lVar17 <= plVar13[-3])) {
              lVar9 = lVar17;
            }
          }
          uVar14 = uVar14 + 1;
          plVar13 = plVar13 + 8;
        } while (lVar16 + (ulong)(lVar16 == 0) != uVar14);
        local_b8 = (ride *)0x0;
        iStack_b0._M_current = (ride *)0x0;
        local_a8 = (ride *)0x0;
        local_60 = uVar15;
        if (prVar1 != prVar7) {
          lVar9 = lVar9 + local_70;
          lVar16 = 0;
          uVar14 = 0;
          do {
            if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >>
                 (uVar14 & 0x3f) & 1) == 0) {
              lVar6 = *(long *)((long)&prVar7->e_time + lVar16);
              if (local_d8.avail_time <= lVar6) {
                lVar12 = local_d8.loc.x - *(long *)((long)&(prVar7->start).x + lVar16);
                lVar17 = -lVar12;
                if (0 < lVar12) {
                  lVar17 = lVar12;
                }
                lVar11 = local_d8.loc.y - *(long *)((long)&(prVar7->start).y + lVar16);
                lVar12 = -lVar11;
                if (0 < lVar11) {
                  lVar12 = lVar11;
                }
                lVar12 = lVar17 + local_d8.avail_time + lVar12;
                lVar17 = *(long *)((long)&prVar7->s_time + lVar16);
                if (lVar12 <= lVar17) {
                  lVar12 = lVar17;
                }
                if ((lVar12 < lVar9) && (lVar12 + *(long *)((long)&prVar7->len + lVar16) <= lVar6))
                {
                  prVar8 = (ride *)((long)&prVar7->id + lVar16);
                  if (iStack_b0._M_current == local_a8) {
                    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
                              ((vector<ride,std::allocator<ride>> *)&local_b8,iStack_b0,prVar8);
                  }
                  else {
                    lVar6 = prVar8->id;
                    lVar17 = prVar8->s_time;
                    lVar12 = prVar8->e_time;
                    lVar11 = prVar8->len;
                    lVar3 = (prVar8->start).x;
                    lVar4 = (prVar8->start).y;
                    lVar5 = (prVar8->end).y;
                    ((iStack_b0._M_current)->end).x = (prVar8->end).x;
                    ((iStack_b0._M_current)->end).y = lVar5;
                    ((iStack_b0._M_current)->start).x = lVar3;
                    ((iStack_b0._M_current)->start).y = lVar4;
                    (iStack_b0._M_current)->e_time = lVar12;
                    (iStack_b0._M_current)->len = lVar11;
                    (iStack_b0._M_current)->id = lVar6;
                    (iStack_b0._M_current)->s_time = lVar17;
                    iStack_b0._M_current = iStack_b0._M_current + 1;
                  }
                }
              }
            }
            iVar2._M_current = iStack_b0._M_current;
            prVar8 = local_b8;
            uVar14 = uVar14 + 1;
            prVar7 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x40;
          } while (uVar14 < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>).
                                          _M_impl.super__Vector_impl_data._M_finish - (long)prVar7
                                   >> 6));
          if (local_b8 == iStack_b0._M_current) {
            iVar10 = 7;
          }
          else {
            uVar14 = (long)iStack_b0._M_current - (long)local_b8 >> 6;
            lVar16 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<ride*,std::vector<ride,std::allocator<ride>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<lensort>>
                      (local_b8,iStack_b0._M_current,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<ride*,std::vector<ride,std::allocator<ride>>>,__gnu_cxx::__ops::_Iter_comp_iter<lensort>>
                      (prVar8,iVar2._M_current);
            uVar14 = local_b8->id;
            if (((long)uVar14 < 0) ||
               (prVar7 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                         super__Vector_impl_data._M_start,
               (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)prVar7 >> 6) <= uVar14)) {
              __assert_fail("min_idx >= 0 && min_idx < rides.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                            ,0xc3,
                            "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                           );
            }
            prVar8 = prVar7 + uVar14;
            this = (vector<ride,std::allocator<ride>> *)
                   ((local_a0->
                    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + local_d8.id);
            iVar2._M_current = *(ride **)(this + 8);
            if (iVar2._M_current == *(ride **)(this + 0x10)) {
              std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
                        (this,iVar2,prVar8);
            }
            else {
              lVar16 = prVar8->id;
              lVar9 = prVar8->s_time;
              lVar6 = prVar8->e_time;
              lVar17 = prVar8->len;
              lVar12 = (prVar8->start).x;
              lVar11 = (prVar8->start).y;
              lVar3 = (prVar8->end).y;
              ((iVar2._M_current)->end).x = (prVar8->end).x;
              ((iVar2._M_current)->end).y = lVar3;
              ((iVar2._M_current)->start).x = lVar12;
              ((iVar2._M_current)->start).y = lVar11;
              (iVar2._M_current)->e_time = lVar6;
              (iVar2._M_current)->len = lVar17;
              (iVar2._M_current)->id = lVar16;
              (iVar2._M_current)->s_time = lVar9;
              *(long *)(this + 8) = *(long *)(this + 8) + 0x40;
            }
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] =
                 local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] |
                 1L << ((byte)uVar14 & 0x3f);
            lVar9 = local_d8.loc.x - (prVar8->start).x;
            lVar16 = -lVar9;
            if (0 < lVar9) {
              lVar16 = lVar9;
            }
            lVar6 = local_d8.loc.y - (prVar8->start).y;
            lVar9 = -lVar6;
            if (0 < lVar6) {
              lVar9 = lVar6;
            }
            lVar9 = lVar16 + local_d8.avail_time + lVar9;
            if (lVar9 <= prVar8->s_time) {
              lVar9 = prVar8->s_time;
            }
            local_d8.avail_time = lVar9 + prVar8->len;
            if (prVar8->e_time < local_d8.avail_time) {
              __assert_fail("v.avail_time <= chosen.e_time",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                            ,0xce,
                            "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                           );
            }
            local_d8.loc.x = (prVar8->end).x;
            local_d8.loc.y = (prVar8->end).y;
            std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                      (&local_98,&local_d8);
            iVar10 = 0;
          }
          if (local_b8 != (ride *)0x0) {
            operator_delete(local_b8,(long)local_a8 - (long)local_b8);
          }
          if ((iVar10 != 7) && (iVar10 != 0)) break;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl
                                    .super__Vector_impl_data._M_finish -
                              (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl
                                    .super__Vector_impl_data._M_start >> 6));
  }
  if (local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return local_a0;
}

Assistant:

Sol earliestStart(const vector<ride>& rides, const long vehs, const long STEPS, const long THRESHOLD, const long rows, const long cols) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_start_time = LONG_MAX;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (start_time < min_start_time && end_time <= r.e_time) {
                min_start_time = start_time;
            }
        }

        vector<ride> idxset;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (min_start_time + THRESHOLD > start_time && end_time <= r.e_time) {
                idxset.push_back(r);
            }
        }

        // rand num between 0 and idxset.size()
        if (idxset.empty()) continue; // leave out this car
//        if (idxset.size() > 2) cerr << "IDXSET size: " << idxset.size() << endl;

        sort(idxset.begin(), idxset.end(), lensort());
        long min_idx = idxset[0].id;
        assert(min_idx >= 0 && min_idx < rides.size());

        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        long closeness = dist(v.loc, chosen.start);
        long start_time = max(v.avail_time + closeness, chosen.s_time);
        v.avail_time = start_time + chosen.len;
        assert(v.avail_time <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}